

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger default_delegate_len(HSQUIRRELVM v)

{
  SQObjectPtr local_18;
  
  local_18.super_SQObject._unVal.nInteger = sq_getsize(v,1);
  local_18.super_SQObject._type = OT_INTEGER;
  SQVM::Push(v,&local_18);
  SQObjectPtr::~SQObjectPtr(&local_18);
  return 1;
}

Assistant:

static SQInteger default_delegate_len(HSQUIRRELVM v)
{
    v->Push(SQInteger(sq_getsize(v,1)));
    return 1;
}